

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserUtils.h
# Opt level: O2

bool ODDLParser::isComment<char>(char *in,char *end)

{
  if ((((*in == '/') && (in + 1 != end)) && (in[1] == '/')) &&
     ((0x19 < (byte)((in[2] & 0xdfU) + 0xbf) || (in[3] != '/')))) {
    return true;
  }
  return false;
}

Assistant:

inline
bool isComment( T *in, T *end ) {
    if ( *in=='/' ) {
        if ( in+1!=end ) {
            if ( *( in+1 )=='/' ) {
                char *drive( ( in+2 ) );
                if ( (isUpperCase<T>( *drive )||isLowerCase<T>( *drive ))&&*( drive+1 )=='/' )  {
                    return false;
                } else {
                    return true;
                }
            }
        }
    }

    return false;
}